

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestDepFileMissing::Run(BuildTestDepFileMissing *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild fo$ o.o: cc foo.c\n",
              (ManifestParserOptions)0x0);
  iVar4 = g_current_test->assertion_failures_;
  if (iVar1 == iVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"foo.c",&local_81);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_82);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"fo o.o",(allocator<char> *)&local_60);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_80,&local_40);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3ad,"builder_.AddTarget(\"fo o.o\", &err)");
    std::__cxx11::string::~string((string *)&local_80);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_40);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3ae,"\"\" == err");
    if (bVar3) {
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_BuildTest).fs_.files_read_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BuildTest).fs_.files_read_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x20,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3af,"1u == fs_.files_read_.size()");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("fo o.o.d",
                                (this->super_BuildTest).fs_.files_read_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3b0,"\"fo o.o.d\" == fs_.files_read_[0]");
        goto LAB_00128bfc;
      }
    }
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
LAB_00128bfc:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TEST_F(BuildTest, DepFileMissing) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build fo$ o.o: cc foo.c\n"));
  fs_.Create("foo.c", "");

  EXPECT_TRUE(builder_.AddTarget("fo o.o", &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("fo o.o.d", fs_.files_read_[0]);
}